

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

void __thiscall
capnp::DynamicList::Builder::Builder(Builder *this,ListSchema schema,OrphanBuilder *orphan)

{
  Which elementType;
  ElementSize elementSize;
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  Type local_60;
  Schema local_50;
  Reader local_48;
  
  local_60.field_4 = schema.elementType.field_4;
  uVar3 = schema.elementType._0_8_;
  (this->schema).elementType.baseType = (Which)uVar3;
  (this->schema).elementType.listDepth = SUB81(uVar3,2);
  (this->schema).elementType.isImplicitParam = SUB81(uVar3,3);
  (this->schema).elementType.field_3 = SUB82(uVar3,4);
  *(short *)&(this->schema).elementType.field_0x6 = SUB82(uVar3,6);
  (this->schema).elementType.field_4.scopeId = (uint64_t)local_60.field_4;
  local_60.listDepth = schema.elementType.listDepth;
  local_60.baseType = LIST;
  if (local_60.listDepth == '\0') {
    local_60.baseType = schema.elementType.baseType;
  }
  local_60._0_8_ = uVar3;
  if (local_60.baseType == STRUCT) {
    local_50.raw = (RawBrandedSchema *)Type::asStruct(&local_60);
    Schema::getProto(&local_48,&local_50);
    uVar2 = 0;
    uVar1 = 0;
    if (0x7f < local_48._reader.dataSize) {
      uVar1 = (uint)*(ushort *)((long)local_48._reader.data + 0xe);
    }
    if (0xcf < local_48._reader.dataSize) {
      uVar2 = (uint)*(ushort *)((long)local_48._reader.data + 0x18) << 0x10;
    }
    _::OrphanBuilder::asStructList(&this->builder,orphan,(StructSize)(uVar2 | uVar1));
  }
  else {
    elementType = local_60.baseType;
    elementSize = anon_unknown_71::elementSizeFor(elementType);
    _::OrphanBuilder::asList(&this->builder,orphan,elementSize);
  }
  return;
}

Assistant:

DynamicList::Builder::Builder(ListSchema schema, _::OrphanBuilder& orphan)
    : schema(schema), builder(schema.whichElementType() == schema::Type::STRUCT
        ? orphan.asStructList(structSizeFromSchema(schema.getStructElementType()))
        : orphan.asList(elementSizeFor(schema.whichElementType()))) {}